

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void stbi__cleanup_jpeg(stbi__jpeg *j)

{
  short **ppsVar1;
  long lVar2;
  
  ppsVar1 = &j->img_comp[0].coeff;
  for (lVar2 = 0; lVar2 < j->s->img_n; lVar2 = lVar2 + 1) {
    if (ppsVar1[-3] != (short *)0x0) {
      free(ppsVar1[-3]);
      ppsVar1[-4] = (short *)0x0;
      ppsVar1[-3] = (short *)0x0;
    }
    if (ppsVar1[-2] != (short *)0x0) {
      free(ppsVar1[-2]);
      ppsVar1[-2] = (short *)0x0;
      *ppsVar1 = (short *)0x0;
    }
    if (ppsVar1[-1] != (short *)0x0) {
      free(ppsVar1[-1]);
      ppsVar1[-1] = (short *)0x0;
    }
    ppsVar1 = ppsVar1 + 0xc;
  }
  return;
}

Assistant:

static void stbi__cleanup_jpeg(stbi__jpeg *j)
{
   int i;
   for (i=0; i < j->s->img_n; ++i) {
      if (j->img_comp[i].raw_data) {
         STBI_FREE(j->img_comp[i].raw_data);
         j->img_comp[i].raw_data = NULL;
         j->img_comp[i].data = NULL;
      }
      if (j->img_comp[i].raw_coeff) {
         STBI_FREE(j->img_comp[i].raw_coeff);
         j->img_comp[i].raw_coeff = 0;
         j->img_comp[i].coeff = 0;
      }
      if (j->img_comp[i].linebuf) {
         STBI_FREE(j->img_comp[i].linebuf);
         j->img_comp[i].linebuf = NULL;
      }
   }
}